

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall cmMakefileTargetGenerator::WriteTargetBuildRules(cmMakefileTargetGenerator *this)

{
  pointer *this_00;
  cmGeneratorTarget *pcVar1;
  cmMakefile *pcVar2;
  cmTarget *this_01;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  cmSourceFile *this_02;
  string_view str;
  bool bVar4;
  const_iterator __first;
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  *this_03;
  cmCustomCommand *cc;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar5;
  reference cc_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  pointer pcVar7;
  pointer pMVar8;
  reference name_00;
  cmFileSet *this_04;
  reference cge;
  reference ppVar9;
  mapped_type *this_05;
  reference ppcVar10;
  pointer ppVar11;
  string *psVar12;
  pair<std::_Rb_tree_const_iterator<const_cmSourceFile_*>,_bool> pVar13;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var15;
  basic_string_view<char,_std::char_traits<char>_> bVar16;
  byte local_c7a;
  string local_bb8;
  basic_string_view<char,_std::char_traits<char>_> local_b98;
  basic_string_view<char,_std::char_traits<char>_> local_b88;
  string local_b78;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b58;
  basic_string_view<char,_std::char_traits<char>_> local_b48;
  basic_string_view<char,_std::char_traits<char>_> local_b38;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_set_type;
  _Self local_b08;
  iterator it_1;
  string *path;
  cmSourceFile *sf_3;
  iterator __end1_4;
  iterator __begin1_4;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1_4;
  cmSourceFile *sf_2;
  iterator __end2_4;
  iterator __begin2_4;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range2_4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredLangs;
  undefined1 local_a68 [8];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *it;
  iterator __end2_3;
  iterator __begin2_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *__range2_3;
  reference local_9f0;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  *__range2_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  files_2;
  undefined1 local_980 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  cmFileSet *file_set;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_3;
  cmTarget *tgt;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  file_set_map;
  string *objectFileName;
  cmSourceFile *sf_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1_2;
  undefined1 local_840 [8];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  string local_820;
  cmValue local_800;
  cmValue pchExtension;
  string local_7d8;
  undefined1 local_7b8 [8];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> extraSources;
  string local_780;
  undefined1 local_760 [8];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> headerSources;
  string local_738;
  reference local_718;
  string *byproduct_1;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts_1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6d0;
  string local_6a8;
  undefined1 local_688 [8];
  cmCustomCommandGenerator beg;
  cmCustomCommand *be;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *__range2_1;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> buildEventCommands;
  string local_4e0;
  reference local_4c0;
  string *byproduct;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts;
  string local_488;
  reference local_468;
  string *output;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_420;
  string local_3f8;
  undefined1 local_3d8 [8];
  cmCustomCommandGenerator ccg;
  cmSourceFile *local_258;
  cmSourceFile *sf;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1_1;
  undefined1 local_218 [8];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  string local_1f8;
  cmValue local_1d8;
  byte local_1c9;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_1c8;
  bool clean;
  undefined1 local_1c0;
  string local_1b8;
  reference local_198;
  string *ispcObj;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_158 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ispcAdditionalObjs;
  string local_130;
  reference local_110;
  string *cfl;
  const_iterator __end2;
  const_iterator __begin2;
  cmList *__range2;
  string *binaryDir;
  cmList files_1;
  string local_c8;
  cmValue local_a8;
  cmValue prop_value_1;
  undefined1 local_90 [8];
  cmList files;
  string local_70;
  cmValue local_50;
  cmValue prop_value;
  anon_class_8_1_8991fb9c evaluatedFiles;
  string local_30;
  cmMakefileTargetGenerator *local_10;
  cmMakefileTargetGenerator *this_local;
  
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  local_10 = this;
  GetConfigName_abi_cxx11_(&local_30,this);
  cmGeneratorTarget::CheckCxxModuleStatus(pcVar1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
  prop_value.Value = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"ADDITIONAL_MAKE_CLEAN_FILES",
             (allocator<char> *)
             ((long)&files.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_50 = cmMakefile::GetProperty(pcVar2,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&files.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar4 = cmValue::operator_cast_to_bool(&local_50);
  if (bVar4) {
    psVar12 = cmValue::operator*[abi_cxx11_(&local_50);
    WriteTargetBuildRules::anon_class_8_1_8991fb9c::operator()
              ((cmList *)local_90,(anon_class_8_1_8991fb9c *)&prop_value,psVar12);
    __first = cmList::begin_abi_cxx11_((cmList *)local_90);
    prop_value_1.Value = (string *)cmList::end_abi_cxx11_((cmList *)local_90);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->CleanFiles,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__first._M_current,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )prop_value_1.Value);
    cmList::~cmList((cmList *)local_90);
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"ADDITIONAL_CLEAN_FILES",
             (allocator<char> *)
             ((long)&files_1.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_a8 = cmGeneratorTarget::GetProperty(pcVar1,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&files_1.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar4 = cmValue::operator_cast_to_bool(&local_a8);
  if (bVar4) {
    psVar12 = cmValue::operator*[abi_cxx11_(&local_a8);
    WriteTargetBuildRules::anon_class_8_1_8991fb9c::operator()
              ((cmList *)&binaryDir,(anon_class_8_1_8991fb9c *)&prop_value,psVar12);
    psVar12 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                        ((cmLocalGenerator *)this->LocalGenerator);
    __end2 = cmList::begin_abi_cxx11_((cmList *)&binaryDir);
    cfl = (string *)cmList::end_abi_cxx11_((cmList *)&binaryDir);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&cfl), bVar4) {
      local_110 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      cmsys::SystemTools::CollapseFullPath(&local_130,local_110,psVar12);
      pVar14 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert(&this->CleanFiles,&local_130);
      ispcAdditionalObjs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVar14.first._M_node;
      std::__cxx11::string::~string((string *)&local_130);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    cmList::~cmList((cmList *)&binaryDir);
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)&__range1,this);
  cmGeneratorTarget::GetGeneratedISPCObjects
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_158,pcVar1,(string *)&__range1);
  std::__cxx11::string::~string((string *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_158);
  ispcObj = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_158);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&ispcObj), bVar4) {
    local_198 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    cmOutputConverter::MaybeRelativeToCurBinDir
              (&local_1b8,(cmOutputConverter *)this->LocalGenerator,local_198);
    pVar14 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::insert(&this->CleanFiles,&local_1b8);
    _Stack_1c8 = pVar14.first._M_node;
    local_1c0 = pVar14.second;
    std::__cxx11::string::~string((string *)&local_1b8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"CLEAN_NO_CUSTOM",
             (allocator<char> *)
             ((long)&customCommands.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1d8 = cmMakefile::GetProperty(pcVar2,&local_1f8);
  bVar4 = cmValue::IsOff(&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&customCommands.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1c9 = bVar4;
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_218);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)&__range1_1,this);
  cmGeneratorTarget::GetCustomCommands
            (pcVar1,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_218
             ,(string *)&__range1_1);
  std::__cxx11::string::~string((string *)&__range1_1);
  __end1_1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        local_218);
  sf = (cmSourceFile *)
       std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                 ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_218);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                             *)&sf), bVar4) {
    ppcVar10 = __gnu_cxx::
               __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
               ::operator*(&__end1_1);
    local_258 = *ppcVar10;
    local_c7a = 0;
    if ((this->CMP0113New & 1U) != 0) {
      this_03 = cmLocalUnixMakefileGenerator3::GetCommandsVisited
                          (this->LocalGenerator,
                           (this->super_cmCommonTargetGenerator).GeneratorTarget);
      pVar13 = std::
               set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
               ::insert(this_03,&local_258);
      ccg.ComputeInternalDepfile._M_invoker = (_Invoker_type)pVar13.first._M_node;
      local_c7a = pVar13.second ^ 0xff;
    }
    if ((local_c7a & 1) == 0) {
      cc = cmSourceFile::GetCustomCommand(local_258);
      GetConfigName_abi_cxx11_(&local_3f8,this);
      pcVar3 = this->LocalGenerator;
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(&local_420);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&outputs);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)local_3d8,cc,&local_3f8,(cmLocalGenerator *)pcVar3,true
                 ,&local_420,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&outputs);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&outputs);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_420);
      std::__cxx11::string::~string((string *)&local_3f8);
      GenerateCustomRuleFile(this,(cmCustomCommandGenerator *)local_3d8);
      if ((local_1c9 & 1) != 0) {
        pvVar6 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                           ((cmCustomCommandGenerator *)local_3d8);
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar6);
        output = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(pvVar6);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&output), bVar4) {
          local_468 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
          cmOutputConverter::MaybeRelativeToCurBinDir
                    (&local_488,(cmOutputConverter *)this->LocalGenerator,local_468);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->CleanFiles,&local_488);
          std::__cxx11::string::~string((string *)&local_488);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        pvVar6 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                           ((cmCustomCommandGenerator *)local_3d8);
        __end3_1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(pvVar6);
        byproduct = (string *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end(pvVar6);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&byproduct), bVar4) {
          local_4c0 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3_1);
          cmOutputConverter::MaybeRelativeToCurBinDir
                    (&local_4e0,(cmOutputConverter *)this->LocalGenerator,local_4c0);
          pVar14 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert(&this->CleanFiles,&local_4e0);
          buildEventCommands.super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVar14.first._M_node;
          std::__cxx11::string::~string((string *)&local_4e0);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3_1);
        }
      }
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_3d8);
    }
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&__end1_1);
  }
  if ((local_1c9 & 1) != 0) {
    pvVar5 = cmGeneratorTarget::GetPreBuildCommands
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&__range2_1,pvVar5);
    pvVar5 = cmGeneratorTarget::GetPreLinkCommands
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    ::cm::
    append<std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>,_0>
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&__range2_1,pvVar5);
    pvVar5 = cmGeneratorTarget::GetPostBuildCommands
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    ::cm::
    append<std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>,_0>
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&__range2_1,pvVar5);
    __end2_1 = std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::begin
                         ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&__range2_1);
    be = (cmCustomCommand *)
         std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::end
                   ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&__range2_1);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
                               *)&be), bVar4) {
      cc_00 = __gnu_cxx::
              __normal_iterator<cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
              ::operator*(&__end2_1);
      beg.ComputeInternalDepfile._M_invoker = (_Invoker_type)cc_00;
      GetConfigName_abi_cxx11_(&local_6a8,this);
      pcVar3 = this->LocalGenerator;
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(&local_6d0);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&byproducts_1);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)local_688,cc_00,&local_6a8,(cmLocalGenerator *)pcVar3,
                 true,&local_6d0,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&byproducts_1);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&byproducts_1);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_6d0);
      std::__cxx11::string::~string((string *)&local_6a8);
      pvVar6 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                         ((cmCustomCommandGenerator *)local_688);
      __end3_2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar6);
      byproduct_1 = (string *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end(pvVar6);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&byproduct_1), bVar4) {
        local_718 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3_2);
        cmOutputConverter::MaybeRelativeToCurBinDir
                  (&local_738,(cmOutputConverter *)this->LocalGenerator,local_718);
        pVar14 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert(&this->CleanFiles,&local_738);
        headerSources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)pVar14.first._M_node;
        std::__cxx11::string::~string((string *)&local_738);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3_2);
      }
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_688);
      __gnu_cxx::
      __normal_iterator<cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
      ::operator++(&__end2_1);
    }
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::~vector
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&__range2_1);
  }
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_760);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&local_780,this);
  cmGeneratorTarget::GetHeaderSources
            (pcVar1,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_760
             ,&local_780);
  std::__cxx11::string::~string((string *)&local_780);
  pcVar7 = std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::
           operator->(&this->OSXBundleGenerator);
  pMVar8 = std::
           unique_ptr<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           ::get(&this->MacOSXContentGenerator);
  GetConfigName_abi_cxx11_
            ((string *)
             &extraSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,this);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar7,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_760
             ,&pMVar8->super_MacOSXContentGeneratorType,
             (string *)
             &extraSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &extraSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_7b8);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&local_7d8,this);
  cmGeneratorTarget::GetExtraSources
            (pcVar1,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_7b8
             ,&local_7d8);
  std::__cxx11::string::~string((string *)&local_7d8);
  pcVar7 = std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::
           operator->(&this->OSXBundleGenerator);
  pMVar8 = std::
           unique_ptr<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           ::get(&this->MacOSXContentGenerator);
  GetConfigName_abi_cxx11_((string *)&pchExtension,this);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar7,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_7b8
             ,&pMVar8->super_MacOSXContentGeneratorType,(string *)&pchExtension);
  std::__cxx11::string::~string((string *)&pchExtension);
  pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_820,"CMAKE_PCH_EXTENSION",
             (allocator<char> *)
             ((long)&externalObjects.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_800 = cmMakefile::GetDefinition(pcVar2,&local_820);
  std::__cxx11::string::~string((string *)&local_820);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&externalObjects.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_840);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)&__range1_2,this);
  cmGeneratorTarget::GetExternalObjects
            (pcVar1,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_840
             ,(string *)&__range1_2);
  std::__cxx11::string::~string((string *)&__range1_2);
  __end1_2 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        local_840);
  sf_1 = (cmSourceFile *)
         std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                   ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_840
                   );
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                             *)&sf_1), bVar4) {
    ppcVar10 = __gnu_cxx::
               __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
               ::operator*(&__end1_2);
    psVar12 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar10);
    str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar12);
    file_set_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_800.Value;
    bVar4 = cmHasSuffix(str,local_800);
    if (!bVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->ExternalObjects,psVar12);
    }
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&__end1_2);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&tgt);
  this_01 = ((this->super_cmCommonTargetGenerator).GeneratorTarget)->Target;
  cmTarget::GetAllFileSetNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__begin1_3,this_01);
  __end1_3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__begin1_3);
  name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__begin1_3);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&name), bVar4) {
    name_00 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1_3);
    this_04 = cmTarget::GetFileSet(this_01,name_00);
    if (this_04 == (cmFileSet *)0x0) {
      pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
      psVar12 = cmTarget::GetName_abi_cxx11_(this_01);
      cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[32],std::__cxx11::string_const&,char_const(&)[25]>
                ((string *)
                 &fileEntries.
                  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [9])0x103f4b0,psVar12
                 ,(char (*) [32])"\" is tracked to have file set \"",name_00,
                 (char (*) [25])"\", but it was not found.");
      cmMakefile::IssueMessage
                (pcVar2,INTERNAL_ERROR,
                 (string *)
                 &fileEntries.
                  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &fileEntries.
                  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      cmFileSet::CompileFileEntries
                ((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  *)&directoryEntries.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,this_04);
      cmFileSet::CompileDirectoryEntries
                ((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  *)&directories.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,this_04);
      pcVar3 = this->LocalGenerator;
      GetConfigName_abi_cxx11_
                ((string *)&files_2._M_t._M_impl.super__Rb_tree_header._M_node_count,this);
      cmFileSet::EvaluateDirectoryEntries
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_980,this_04,
                 (vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  *)&directories.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(cmLocalGenerator *)pcVar3,
                 (string *)&files_2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (this->super_cmCommonTargetGenerator).GeneratorTarget,
                 (cmGeneratorExpressionDAGChecker *)0x0);
      std::__cxx11::string::~string
                ((string *)&files_2._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             *)&__range2_2);
      this_00 = &directoryEntries.
                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __end2_2 = std::
                 vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                 ::begin((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                          *)this_00);
      entry = (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)std::
                 vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                 ::end((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                        *)this_00);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                                 *)&entry), bVar4) {
        cge = __gnu_cxx::
              __normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
              ::operator*(&__end2_2);
        pcVar3 = this->LocalGenerator;
        local_9f0 = cge;
        GetConfigName_abi_cxx11_((string *)&__range2_3,this);
        cmFileSet::EvaluateFileEntry
                  (this_04,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_980,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)&__range2_2,cge,(cmLocalGenerator *)pcVar3,(string *)&__range2_3,
                   (this->super_cmCommonTargetGenerator).GeneratorTarget,
                   (cmGeneratorExpressionDAGChecker *)0x0);
        std::__cxx11::string::~string((string *)&__range2_3);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
        ::operator++(&__end2_2);
      }
      __end2_3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          *)&__range2_2);
      it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)&__range2_2);
      while (bVar4 = std::operator!=(&__end2_3,(_Self *)&it), bVar4) {
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator*(&__end2_3);
        __end3_3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&ppVar9->second);
        filename = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&ppVar9->second);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end3_3,
                                  (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&filename), bVar4) {
          objectSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)__gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end3_3);
          psVar12 = cmFileSet::GetType_abi_cxx11_(this_04);
          this_05 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&tgt,(key_type *)
                                         objectSources.
                                         super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::operator=((string *)this_05,(string *)psVar12);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3_3);
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++(&__end2_3);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              *)&__range2_2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_980);
      std::
      vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ::~vector((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                 *)&directories.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ::~vector((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                 *)&directoryEntries.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__begin1_3);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_a68);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_
            ((string *)&requiredLangs._M_t._M_impl.super__Rb_tree_header._M_node_count,this);
  cmGeneratorTarget::GetObjectSources
            (pcVar1,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_a68
             ,(string *)&requiredLangs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string
            ((string *)&requiredLangs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range2_4);
  bVar4 = cmCommonTargetGenerator::HaveRequiredLanguages
                    (&this->super_cmCommonTargetGenerator,
                     (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                     local_a68,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2_4);
  if (bVar4) {
    __end2_4 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                         ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                          local_a68);
    sf_2 = (cmSourceFile *)
           std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                     ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                      local_a68);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                               *)&sf_2), bVar4) {
      ppcVar10 = __gnu_cxx::
                 __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                 ::operator*(&__end2_4);
      WriteObjectRuleFiles(this,*ppcVar10);
      __gnu_cxx::
      __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::operator++(&__end2_4);
    }
  }
  __end1_4 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        local_a68);
  sf_3 = (cmSourceFile *)
         std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                   ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_a68
                   );
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end1_4,
                       (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                        *)&sf_3);
    if (!bVar4) break;
    ppcVar10 = __gnu_cxx::
               __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
               ::operator*(&__end1_4);
    this_02 = *ppcVar10;
    it_1._M_node = (_Base_ptr)cmSourceFile::GetFullPath_abi_cxx11_(this_02);
    local_b08._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&tgt,(key_type *)it_1._M_node);
    file_set_type =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&tgt);
    bVar4 = std::operator!=(&local_b08,(_Self *)&file_set_type);
    if (bVar4) {
      ppVar11 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator->(&local_b08);
      local_b18 = &ppVar11->second;
      _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b18);
      local_b28 = _Var15;
      bVar16 = (basic_string_view<char,_std::char_traits<char>_>)
               ::cm::operator____s("CXX_MODULES",0xb);
      local_b48 = bVar16;
      local_b38 = bVar16;
      bVar4 = std::operator==(local_b28,bVar16);
      if (bVar4) {
        cmSourceFile::GetLanguage_abi_cxx11_(&local_b78,this_02);
        _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b78);
        local_b58 = _Var15;
        bVar16 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("CXX",3);
        local_b98 = bVar16;
        local_b88 = bVar16;
        bVar4 = std::operator!=(local_b58,bVar16);
        std::__cxx11::string::~string((string *)&local_b78);
        if (bVar4) {
          pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
          psVar12 = cmTarget::GetName_abi_cxx11_(this_01);
          cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[25],std::__cxx11::string_const&,char_const(&)[25],std::__cxx11::string_const&,char_const(&)[54]>
                    (&local_bb8,(char (*) [9])0x103f4b0,psVar12,
                     (char (*) [25])"\" contains the source\n  ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     it_1._M_node,(char (*) [25])"\nin a file set of type \"",local_b18,
                     (char (*) [54])"\" but the source is not classified as a \"CXX\" source.");
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_bb8);
          std::__cxx11::string::~string((string *)&local_bb8);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&__end1_4);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&__range2_4);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_a68);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&tgt);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_840);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_7b8);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_760);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_218);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_158);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetBuildRules()
{
  this->GeneratorTarget->CheckCxxModuleStatus(this->GetConfigName());

  // -- Write the custom commands for this target

  // Evaluates generator expressions and expands prop_value
  auto evaluatedFiles = [this](const std::string& prop_value) -> cmList {
    cmList files{ cmGeneratorExpression::Evaluate(
      prop_value, this->LocalGenerator, this->GetConfigName(),
      this->GeneratorTarget) };
    return files;
  };

  // Look for additional files registered for cleaning in this directory.
  if (cmValue prop_value =
        this->Makefile->GetProperty("ADDITIONAL_MAKE_CLEAN_FILES")) {
    auto const files = evaluatedFiles(*prop_value);
    this->CleanFiles.insert(files.begin(), files.end());
  }

  // Look for additional files registered for cleaning in this target.
  if (cmValue prop_value =
        this->GeneratorTarget->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    auto const files = evaluatedFiles(*prop_value);
    // For relative path support
    std::string const& binaryDir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    for (std::string const& cfl : files) {
      this->CleanFiles.insert(cmSystemTools::CollapseFullPath(cfl, binaryDir));
    }
  }

  // Look for ISPC extra object files generated by this target
  auto const ispcAdditionalObjs =
    this->GeneratorTarget->GetGeneratedISPCObjects(this->GetConfigName());
  for (std::string const& ispcObj : ispcAdditionalObjs) {
    this->CleanFiles.insert(
      this->LocalGenerator->MaybeRelativeToCurBinDir(ispcObj));
  }

  // add custom commands to the clean rules?
  bool const clean = this->Makefile->GetProperty("CLEAN_NO_CUSTOM").IsOff();

  // First generate the object rule files.  Save a list of all object
  // files for this target.
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands,
                                           this->GetConfigName());
  for (cmSourceFile const* sf : customCommands) {
    if (this->CMP0113New &&
        !this->LocalGenerator->GetCommandsVisited(this->GeneratorTarget)
           .insert(sf)
           .second) {
      continue;
    }
    cmCustomCommandGenerator ccg(*sf->GetCustomCommand(),
                                 this->GetConfigName(), this->LocalGenerator);
    this->GenerateCustomRuleFile(ccg);
    if (clean) {
      const std::vector<std::string>& outputs = ccg.GetOutputs();
      for (std::string const& output : outputs) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(output));
      }
      const std::vector<std::string>& byproducts = ccg.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(byproduct));
      }
    }
  }

  // Add byproducts from build events to the clean rules
  if (clean) {
    std::vector<cmCustomCommand> buildEventCommands =
      this->GeneratorTarget->GetPreBuildCommands();

    cm::append(buildEventCommands,
               this->GeneratorTarget->GetPreLinkCommands());
    cm::append(buildEventCommands,
               this->GeneratorTarget->GetPostBuildCommands());

    for (const auto& be : buildEventCommands) {
      cmCustomCommandGenerator beg(be, this->GetConfigName(),
                                   this->LocalGenerator);
      const std::vector<std::string>& byproducts = beg.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(byproduct));
      }
    }
  }
  std::vector<cmSourceFile const*> headerSources;
  this->GeneratorTarget->GetHeaderSources(headerSources,
                                          this->GetConfigName());
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    headerSources, this->MacOSXContentGenerator.get(), this->GetConfigName());
  std::vector<cmSourceFile const*> extraSources;
  this->GeneratorTarget->GetExtraSources(extraSources, this->GetConfigName());
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    extraSources, this->MacOSXContentGenerator.get(), this->GetConfigName());
  cmValue pchExtension = this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");
  std::vector<cmSourceFile const*> externalObjects;
  this->GeneratorTarget->GetExternalObjects(externalObjects,
                                            this->GetConfigName());
  for (cmSourceFile const* sf : externalObjects) {
    auto const& objectFileName = sf->GetFullPath();
    if (!cmHasSuffix(objectFileName, pchExtension)) {
      this->ExternalObjects.push_back(objectFileName);
    }
  }

  std::map<std::string, std::string> file_set_map;

  auto const* tgt = this->GeneratorTarget->Target;
  for (auto const& name : tgt->GetAllFileSetNames()) {
    auto const* file_set = tgt->GetFileSet(name);
    if (!file_set) {
      this->Makefile->IssueMessage(
        MessageType::INTERNAL_ERROR,
        cmStrCat("Target \"", tgt->GetName(),
                 "\" is tracked to have file set \"", name,
                 "\", but it was not found."));
      continue;
    }

    auto fileEntries = file_set->CompileFileEntries();
    auto directoryEntries = file_set->CompileDirectoryEntries();
    auto directories = file_set->EvaluateDirectoryEntries(
      directoryEntries, this->LocalGenerator, this->GetConfigName(),
      this->GeneratorTarget);

    std::map<std::string, std::vector<std::string>> files;
    for (auto const& entry : fileEntries) {
      file_set->EvaluateFileEntry(directories, files, entry,
                                  this->LocalGenerator, this->GetConfigName(),
                                  this->GeneratorTarget);
    }

    for (auto const& it : files) {
      for (auto const& filename : it.second) {
        file_set_map[filename] = file_set->GetType();
      }
    }
  }

  std::vector<cmSourceFile const*> objectSources;
  this->GeneratorTarget->GetObjectSources(objectSources,
                                          this->GetConfigName());

  // validate that all languages requested are enabled.
  std::set<std::string> requiredLangs;
  if (this->HaveRequiredLanguages(objectSources, requiredLangs)) {
    for (cmSourceFile const* sf : objectSources) {
      // Generate this object file's rule file.
      this->WriteObjectRuleFiles(*sf);
    }
  }

  for (cmSourceFile const* sf : objectSources) {
    auto const& path = sf->GetFullPath();
    auto const it = file_set_map.find(path);
    if (it != file_set_map.end()) {
      auto const& file_set_type = it->second;
      if (file_set_type == "CXX_MODULES"_s) {
        if (sf->GetLanguage() != "CXX"_s) {
          this->Makefile->IssueMessage(
            MessageType::FATAL_ERROR,
            cmStrCat(
              "Target \"", tgt->GetName(), "\" contains the source\n  ", path,
              "\nin a file set of type \"", file_set_type,
              R"(" but the source is not classified as a "CXX" source.)"));
        }
      }
    }
  }
}